

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

FeatureVectorizer_InputColumn * __thiscall
google::protobuf::Arena::DoCreateMessage<CoreML::Specification::FeatureVectorizer_InputColumn>
          (Arena *this)

{
  FeatureVectorizer_InputColumn *this_00;
  
  this_00 = (FeatureVectorizer_InputColumn *)
            AllocateAlignedWithHook
                      (this,0x28,
                       (type_info *)&CoreML::Specification::FeatureVectorizer_InputColumn::typeinfo)
  ;
  CoreML::Specification::FeatureVectorizer_InputColumn::FeatureVectorizer_InputColumn
            (this_00,this,false);
  return this_00;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }